

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AST.cpp
# Opt level: O1

unique_ptr<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_> __thiscall
cmm::BinaryOperatorAST::tryFoldBinOpRelation
          (BinaryOperatorAST *this,TokenKind TokenKind,
          unique_ptr<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_> *LHS,
          unique_ptr<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_> *RHS)

{
  AST AVar1;
  int iVar2;
  ExpressionAST *pEVar3;
  ExpressionAST *pEVar4;
  AST AVar5;
  int iVar6;
  uint uVar7;
  _func_int **pp_Var8;
  ulong uVar9;
  byte bVar10;
  byte bVar11;
  bool bVar12;
  string R;
  string L;
  _Head_base<0UL,_cmm::ExpressionAST_*,_false> local_80;
  undefined1 *local_78;
  ulong local_70;
  undefined1 local_68 [16];
  undefined1 *local_58;
  ulong local_50;
  undefined1 local_48 [16];
  _Head_base<0UL,_cmm::ExpressionAST_*,_false> local_38;
  
  pEVar3 = (LHS->_M_t).
           super___uniq_ptr_impl<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_>._M_t.
           super__Tuple_impl<0UL,_cmm::ExpressionAST_*,_std::default_delete<cmm::ExpressionAST>_>.
           super__Head_base<0UL,_cmm::ExpressionAST_*,_false>._M_head_impl;
  if (((pEVar3->Kind == IntExpression) &&
      (pEVar4 = (RHS->_M_t).
                super___uniq_ptr_impl<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_>.
                _M_t.
                super__Tuple_impl<0UL,_cmm::ExpressionAST_*,_std::default_delete<cmm::ExpressionAST>_>
                .super__Head_base<0UL,_cmm::ExpressionAST_*,_false>._M_head_impl,
      pEVar4->Kind == IntExpression)) && (TokenKind - Less < 6)) {
    iVar6 = *(int *)&pEVar3->field_0xc;
    iVar2 = *(int *)&pEVar4->field_0xc;
    switch(TokenKind) {
    case Less:
      pp_Var8 = (_func_int **)operator_new(0x10);
      *(undefined4 *)(pp_Var8 + 1) = 2;
      *pp_Var8 = (_func_int *)&PTR__AST_00123930;
      *(bool *)((long)pp_Var8 + 0xc) = iVar6 < iVar2;
      break;
    case LessEqual:
      pp_Var8 = (_func_int **)operator_new(0x10);
      *(undefined4 *)(pp_Var8 + 1) = 2;
      *pp_Var8 = (_func_int *)&PTR__AST_00123930;
      *(bool *)((long)pp_Var8 + 0xc) = iVar6 <= iVar2;
      break;
    case EqualEqual:
      pp_Var8 = (_func_int **)operator_new(0x10);
      *(undefined4 *)(pp_Var8 + 1) = 2;
      *pp_Var8 = (_func_int *)&PTR__AST_00123930;
      *(bool *)((long)pp_Var8 + 0xc) = iVar6 == iVar2;
      break;
    case ExclaimEqual:
      pp_Var8 = (_func_int **)operator_new(0x10);
      *(undefined4 *)(pp_Var8 + 1) = 2;
      *pp_Var8 = (_func_int *)&PTR__AST_00123930;
      *(bool *)((long)pp_Var8 + 0xc) = iVar6 != iVar2;
      break;
    case Greater:
      pp_Var8 = (_func_int **)operator_new(0x10);
      *(undefined4 *)(pp_Var8 + 1) = 2;
      *pp_Var8 = (_func_int *)&PTR__AST_00123930;
      *(bool *)((long)pp_Var8 + 0xc) = iVar2 < iVar6;
      break;
    case GreaterEqual:
      pp_Var8 = (_func_int **)operator_new(0x10);
      *(undefined4 *)(pp_Var8 + 1) = 2;
      *pp_Var8 = (_func_int *)&PTR__AST_00123930;
      *(bool *)((long)pp_Var8 + 0xc) = iVar2 <= iVar6;
    }
    goto LAB_001156fe;
  }
  pEVar3 = (LHS->_M_t).
           super___uniq_ptr_impl<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_>._M_t.
           super__Tuple_impl<0UL,_cmm::ExpressionAST_*,_std::default_delete<cmm::ExpressionAST>_>.
           super__Head_base<0UL,_cmm::ExpressionAST_*,_false>._M_head_impl;
  if ((pEVar3->Kind == StringExpression) &&
     (((RHS->_M_t).
       super___uniq_ptr_impl<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_>._M_t.
       super__Tuple_impl<0UL,_cmm::ExpressionAST_*,_std::default_delete<cmm::ExpressionAST>_>.
       super__Head_base<0UL,_cmm::ExpressionAST_*,_false>._M_head_impl)->Kind == StringExpression))
  {
    local_58 = local_48;
    AVar5._vptr_AST = pEVar3[1].super_AST._vptr_AST;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_58,AVar5._vptr_AST,*(long *)&pEVar3[1].Kind + (long)AVar5._vptr_AST)
    ;
    pEVar3 = (RHS->_M_t).
             super___uniq_ptr_impl<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_>.
             _M_t.
             super__Tuple_impl<0UL,_cmm::ExpressionAST_*,_std::default_delete<cmm::ExpressionAST>_>.
             super__Head_base<0UL,_cmm::ExpressionAST_*,_false>._M_head_impl;
    local_78 = local_68;
    AVar5._vptr_AST = pEVar3[1].super_AST._vptr_AST;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_78,AVar5._vptr_AST,*(long *)&pEVar3[1].Kind + (long)AVar5._vptr_AST)
    ;
    switch(TokenKind) {
    case Less:
      pp_Var8 = (_func_int **)operator_new(0x10);
      uVar9 = local_50;
      if (local_70 < local_50) {
        uVar9 = local_70;
      }
      if (uVar9 == 0) {
        uVar9 = 0;
      }
      else {
        uVar7 = memcmp(local_58,local_78,uVar9);
        uVar9 = (ulong)uVar7;
      }
      if ((int)uVar9 == 0) {
        uVar9 = 0xffffffff80000000;
        if (-0x80000000 < (long)(local_50 - local_70)) {
          uVar9 = local_50 - local_70;
        }
        if (0x7ffffffe < (long)uVar9) {
          uVar9 = 0;
        }
      }
      bVar12 = (bool)((byte)(uVar9 >> 0x1f) & 1);
      break;
    case LessEqual:
      pp_Var8 = (_func_int **)operator_new(0x10);
      uVar9 = local_50;
      if (local_70 < local_50) {
        uVar9 = local_70;
      }
      if (uVar9 == 0) {
        uVar9 = 0;
      }
      else {
        uVar7 = memcmp(local_58,local_78,uVar9);
        uVar9 = (ulong)uVar7;
      }
      if ((int)uVar9 == 0) {
        uVar9 = 0xffffffff80000000;
        if (-0x80000000 < (long)(local_50 - local_70)) {
          uVar9 = local_50 - local_70;
        }
        if (0x7ffffffe < (long)uVar9) {
          uVar9 = 0x7fffffff;
        }
      }
      bVar12 = (int)uVar9 < 1;
      break;
    case EqualEqual:
      pp_Var8 = (_func_int **)operator_new(0x10);
      if (local_50 == local_70) {
        if (local_50 == 0) {
          bVar12 = true;
        }
        else {
          iVar6 = bcmp(local_58,local_78,local_50);
          bVar12 = iVar6 == 0;
        }
      }
      else {
LAB_001152dc:
        bVar12 = false;
      }
      break;
    case ExclaimEqual:
      pp_Var8 = (_func_int **)operator_new(0x10);
      bVar12 = true;
      if (local_50 == local_70) {
        if (local_50 == 0) goto LAB_001152dc;
        iVar6 = bcmp(local_58,local_78,local_50);
        bVar12 = iVar6 != 0;
      }
      break;
    case Greater:
      pp_Var8 = (_func_int **)operator_new(0x10);
      uVar9 = local_50;
      if (local_70 < local_50) {
        uVar9 = local_70;
      }
      if (uVar9 == 0) {
        uVar9 = 0;
      }
      else {
        uVar7 = memcmp(local_58,local_78,uVar9);
        uVar9 = (ulong)uVar7;
      }
      if ((int)uVar9 == 0) {
        uVar9 = 0xffffffff80000000;
        if (-0x80000000 < (long)(local_50 - local_70)) {
          uVar9 = local_50 - local_70;
        }
        if (0x7ffffffe < (long)uVar9) {
          uVar9 = 0x7fffffff;
        }
      }
      bVar12 = 0 < (int)uVar9;
      break;
    case GreaterEqual:
      pp_Var8 = (_func_int **)operator_new(0x10);
      uVar9 = local_50;
      if (local_70 < local_50) {
        uVar9 = local_70;
      }
      if (uVar9 == 0) {
        uVar9 = 0;
      }
      else {
        uVar7 = memcmp(local_58,local_78,uVar9);
        uVar9 = (ulong)uVar7;
      }
      if ((int)uVar9 == 0) {
        uVar9 = 0xffffffff80000000;
        if (-0x80000000 < (long)(local_50 - local_70)) {
          uVar9 = local_50 - local_70;
        }
        if (0x7ffffffe < (long)uVar9) {
          uVar9 = 0x7fffffff;
        }
      }
      bVar12 = -1 < (int)uVar9;
      break;
    default:
      bVar12 = true;
      goto LAB_00115479;
    }
    *(undefined4 *)(pp_Var8 + 1) = 2;
    *pp_Var8 = (_func_int *)&PTR__AST_00123930;
    *(bool *)((long)pp_Var8 + 0xc) = bVar12;
    (this->super_ExpressionAST).super_AST._vptr_AST = pp_Var8;
    bVar12 = false;
LAB_00115479:
    if (local_78 != local_68) {
      operator_delete(local_78);
    }
    if (local_58 != local_48) {
      operator_delete(local_58);
    }
    if (!bVar12) {
      return (unique_ptr<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_>)this;
    }
  }
  pEVar3 = (LHS->_M_t).
           super___uniq_ptr_impl<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_>._M_t.
           super__Tuple_impl<0UL,_cmm::ExpressionAST_*,_std::default_delete<cmm::ExpressionAST>_>.
           super__Head_base<0UL,_cmm::ExpressionAST_*,_false>._M_head_impl;
  if (((pEVar3->Kind != DoubleExpression) ||
      (pEVar4 = (RHS->_M_t).
                super___uniq_ptr_impl<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_>.
                _M_t.
                super__Tuple_impl<0UL,_cmm::ExpressionAST_*,_std::default_delete<cmm::ExpressionAST>_>
                .super__Head_base<0UL,_cmm::ExpressionAST_*,_false>._M_head_impl,
      pEVar4->Kind != DoubleExpression)) || (5 < TokenKind - Less)) {
    pEVar3 = (LHS->_M_t).
             super___uniq_ptr_impl<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_>.
             _M_t.
             super__Tuple_impl<0UL,_cmm::ExpressionAST_*,_std::default_delete<cmm::ExpressionAST>_>.
             super__Head_base<0UL,_cmm::ExpressionAST_*,_false>._M_head_impl;
    if (((pEVar3->Kind != BoolExpression) ||
        (pEVar4 = (RHS->_M_t).
                  super___uniq_ptr_impl<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_cmm::ExpressionAST_*,_std::default_delete<cmm::ExpressionAST>_>
                  .super__Head_base<0UL,_cmm::ExpressionAST_*,_false>._M_head_impl,
        pEVar4->Kind != BoolExpression)) || (5 < TokenKind - Less)) {
      local_38._M_head_impl =
           (LHS->_M_t).
           super___uniq_ptr_impl<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_>._M_t.
           super__Tuple_impl<0UL,_cmm::ExpressionAST_*,_std::default_delete<cmm::ExpressionAST>_>.
           super__Head_base<0UL,_cmm::ExpressionAST_*,_false>._M_head_impl;
      (LHS->_M_t).
      super___uniq_ptr_impl<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_>._M_t.
      super__Tuple_impl<0UL,_cmm::ExpressionAST_*,_std::default_delete<cmm::ExpressionAST>_>.
      super__Head_base<0UL,_cmm::ExpressionAST_*,_false>._M_head_impl = (ExpressionAST *)0x0;
      local_80._M_head_impl =
           (RHS->_M_t).
           super___uniq_ptr_impl<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_>._M_t.
           super__Tuple_impl<0UL,_cmm::ExpressionAST_*,_std::default_delete<cmm::ExpressionAST>_>.
           super__Head_base<0UL,_cmm::ExpressionAST_*,_false>._M_head_impl;
      (RHS->_M_t).
      super___uniq_ptr_impl<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_>._M_t.
      super__Tuple_impl<0UL,_cmm::ExpressionAST_*,_std::default_delete<cmm::ExpressionAST>_>.
      super__Head_base<0UL,_cmm::ExpressionAST_*,_false>._M_head_impl = (ExpressionAST *)0x0;
      create(this,TokenKind,
             (unique_ptr<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_> *)&local_38,
             (unique_ptr<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_> *)&local_80);
      if (local_80._M_head_impl != (ExpressionAST *)0x0) {
        (*((local_80._M_head_impl)->super_AST)._vptr_AST[1])();
      }
      local_80._M_head_impl = (ExpressionAST *)0x0;
      if (local_38._M_head_impl == (ExpressionAST *)0x0) {
        return (unique_ptr<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_>)this;
      }
      (*((local_38._M_head_impl)->super_AST)._vptr_AST[1])();
      return (unique_ptr<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_>)this;
    }
    bVar11 = pEVar3->field_0xc;
    bVar10 = pEVar4->field_0xc;
    switch(TokenKind) {
    case Less:
      pp_Var8 = (_func_int **)operator_new(0x10);
      bVar10 = bVar10 & (bVar11 ^ 1);
      break;
    case LessEqual:
      pp_Var8 = (_func_int **)operator_new(0x10);
      bVar11 = bVar11 ^ 1;
      goto LAB_001156e6;
    case EqualEqual:
      pp_Var8 = (_func_int **)operator_new(0x10);
      bVar11 = bVar11 ^ bVar10 ^ 1;
      goto LAB_001156a2;
    case ExclaimEqual:
      pp_Var8 = (_func_int **)operator_new(0x10);
      bVar10 = bVar10 ^ bVar11;
      break;
    case Greater:
      pp_Var8 = (_func_int **)operator_new(0x10);
      bVar11 = bVar11 & ~bVar10;
LAB_001156a2:
      *(undefined4 *)(pp_Var8 + 1) = 2;
      *pp_Var8 = (_func_int *)&PTR__AST_00123930;
      *(byte *)((long)pp_Var8 + 0xc) = bVar11;
      goto LAB_001156fe;
    case GreaterEqual:
      pp_Var8 = (_func_int **)operator_new(0x10);
      bVar10 = bVar10 ^ 1;
LAB_001156e6:
      bVar10 = bVar10 | bVar11;
    }
    *(undefined4 *)(pp_Var8 + 1) = 2;
    *pp_Var8 = (_func_int *)&PTR__AST_00123930;
    *(byte *)((long)pp_Var8 + 0xc) = bVar10;
    goto LAB_001156fe;
  }
  AVar5._vptr_AST = pEVar3[1].super_AST._vptr_AST;
  AVar1._vptr_AST = pEVar4[1].super_AST._vptr_AST;
  switch(TokenKind) {
  case Less:
    pp_Var8 = (_func_int **)operator_new(0x10);
    bVar12 = (double)AVar1._vptr_AST < (double)AVar5._vptr_AST;
    break;
  case LessEqual:
    pp_Var8 = (_func_int **)operator_new(0x10);
    bVar12 = (double)AVar1._vptr_AST < (double)AVar5._vptr_AST;
    goto LAB_00115668;
  case EqualEqual:
    pp_Var8 = (_func_int **)operator_new(0x10);
    bVar12 = (double)AVar5._vptr_AST == (double)AVar1._vptr_AST;
    goto LAB_00115621;
  case ExclaimEqual:
    pp_Var8 = (_func_int **)operator_new(0x10);
    bVar12 = (double)AVar5._vptr_AST != (double)AVar1._vptr_AST;
LAB_00115621:
    *(undefined4 *)(pp_Var8 + 1) = 2;
    *pp_Var8 = (_func_int *)&PTR__AST_00123930;
    *(bool *)((long)pp_Var8 + 0xc) = bVar12;
    goto LAB_001156fe;
  case Greater:
    pp_Var8 = (_func_int **)operator_new(0x10);
    bVar12 = (double)AVar5._vptr_AST < (double)AVar1._vptr_AST;
    break;
  case GreaterEqual:
    pp_Var8 = (_func_int **)operator_new(0x10);
    bVar12 = (double)AVar5._vptr_AST < (double)AVar1._vptr_AST;
LAB_00115668:
    *(undefined4 *)(pp_Var8 + 1) = 2;
    *pp_Var8 = (_func_int *)&PTR__AST_00123930;
    *(bool *)((long)pp_Var8 + 0xc) = !bVar12;
    goto LAB_001156fe;
  }
  *(undefined4 *)(pp_Var8 + 1) = 2;
  *pp_Var8 = (_func_int *)&PTR__AST_00123930;
  *(bool *)((long)pp_Var8 + 0xc) = !bVar12 && (double)AVar5._vptr_AST != (double)AVar1._vptr_AST;
LAB_001156fe:
  (this->super_ExpressionAST).super_AST._vptr_AST = pp_Var8;
  return (__uniq_ptr_data<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>,_true,_true>)
         (__uniq_ptr_data<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>,_true,_true>)
         this;
}

Assistant:

std::unique_ptr<ExpressionAST>
BinaryOperatorAST::tryFoldBinOpRelation(Token::TokenKind TokenKind,
                                        std::unique_ptr<ExpressionAST> LHS,
                                        std::unique_ptr<ExpressionAST> RHS) {

#define CASE(TOKEN_KIND, OPERATOR)                                             \
  case Token::TOKEN_KIND:                                                      \
    return std::unique_ptr<BoolAST>(new BoolAST(L OPERATOR R))

#define TRY_COMPARE(type, Type)                                                \
  do {                                                                         \
    if (LHS->is##Type() && RHS->is##Type()) {                                  \
      type L = LHS->as_cptr<Type##AST>()->getValue();                          \
      type R = RHS->as_cptr<Type##AST>()->getValue();                          \
      switch (TokenKind) {                                                     \
      default: break;                                                          \
      CASE(Less, <);                                                           \
      CASE(LessEqual, <=);                                                     \
      CASE(EqualEqual, ==);                                                    \
      CASE(ExclaimEqual, !=);                                                  \
      CASE(GreaterEqual, >=);                                                  \
      CASE(Greater, >);                                                        \
      }                                                                        \
    }                                                                          \
  } while (0)

  TRY_COMPARE(int, Int);
  TRY_COMPARE(std::string, String);
  TRY_COMPARE(double, Double);
  TRY_COMPARE(bool, Bool);

#undef TRY_COMPARE
#undef CASE

  // TODO: Not very elegant, but this is ok.
  return BinaryOperatorAST::create(TokenKind, std::move(LHS), std::move(RHS));
}